

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

void specialcat(char *targ,char *src,int trimtarg)

{
  char *local_28;
  char *last;
  char *pcStack_18;
  int trimtarg_local;
  char *src_local;
  char *targ_local;
  
  local_28 = (char *)0x0;
  for (src_local = targ; *src_local != '\0'; src_local = src_local + 1) {
    local_28 = src_local;
  }
  pcStack_18 = src;
  if (((trimtarg != 0) && (local_28 != (char *)0x0)) && (*local_28 == '/')) {
    *local_28 = '\0';
    src_local = local_28;
  }
  for (; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
    *src_local = *pcStack_18;
    src_local = src_local + 1;
  }
  *src_local = '\0';
  return;
}

Assistant:

static void
specialcat(char *targ,char *src,int trimtarg)
{
    char *last = 0;

    while( *targ) {
        last = targ;
        targ++;
    }
    /* TARG now points at terminating NUL */
    /* LAST points at final character in targ. */
    if (trimtarg ) {
        if (last && *last == '/') {
            /* Truncate. */
            *last = 0;
            targ = last;
            /* TARG again points at terminating NUL */
        }
    }
    while (*src) {
        *targ = *src;
        targ++;
        src++;
    }
    *targ = 0;
}